

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O0

float __thiscall embree::XMLLoader::load<float>(XMLLoader *this,Ref<embree::XML> *xml)

{
  size_type sVar1;
  runtime_error *this_00;
  Token *in_RSI;
  float fVar2;
  ParseLocation *in_stack_00000028;
  char *__rhs;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffff8c;
  string local_48 [31];
  undefined1 in_stack_ffffffffffffffd7;
  
  sVar1 = std::vector<embree::Token,_std::allocator<embree::Token>_>::size
                    ((vector<embree::Token,_std::allocator<embree::Token>_> *)
                     (*(long *)in_RSI + 0x98));
  if (sVar1 != 1) {
    uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffff88);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    __rhs = *(char **)in_RSI;
    ParseLocation::str_abi_cxx11_(in_stack_00000028);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffff8c,uVar3),__rhs);
    std::runtime_error::runtime_error(this_00,local_48);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::vector<embree::Token,_std::allocator<embree::Token>_>::operator[]
            ((vector<embree::Token,_std::allocator<embree::Token>_> *)(*(long *)in_RSI + 0x98),0);
  fVar2 = Token::Float(in_RSI,(bool)in_stack_ffffffffffffffd7);
  return fVar2;
}

Assistant:

float XMLLoader::load<float>(const Ref<XML>& xml) {
    if (xml->body.size() != 1) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong float body");
    return xml->body[0].Float();
  }